

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test UTF-8",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- From UTF-8",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Correct",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  test_to<char>("\x7f",0x7f);
  test_to<char>(anon_var_dwarf_3637,0x80);
  test_to<char>(anon_var_dwarf_364d,0x7ff);
  test_to<char>(anon_var_dwarf_3657,0x800);
  test_to<char>(anon_var_dwarf_366d,0xffff);
  test_to<char>(anon_var_dwarf_3677,0x10000);
  test_to<char>(anon_var_dwarf_368d,0x10ffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Too big",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  test_to<char>(anon_var_dwarf_36a1,0xffffffff);
  test_to<char>(anon_var_dwarf_3a82,0xffffffff);
  test_to<char>(anon_var_dwarf_3a8c,0xffffffff);
  test_to<char>(anon_var_dwarf_3aa2,0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Invalid length",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  make2::buf[0] = 0xc2;
  make2::buf[1] = 0x80;
  test_to<char>((char *)make2::buf,0x80);
  make2::buf[0] = 0xdf;
  make2::buf[1] = 0xbf;
  test_to<char>((char *)make2::buf,0x7ff);
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  test_to<char>((char *)make3::buf,0x800);
  make3::buf[0] = 0xef;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  test_to<char>((char *)make3::buf,0xffff);
  builtin_memcpy(make4::buf,"𐀀",4);
  test_to<char>((char *)make4::buf,0x10000);
  builtin_memcpy(make4::buf,"\x0010ffff",4);
  test_to<char>((char *)make4::buf,0x10ffff);
  make4::buf[0] = 0xf4;
  make4::buf[1] = 0x90;
  make4::buf[2] = 0x80;
  make4::buf[3] = 0x80;
  test_to<char>((char *)make4::buf,0xffffffff);
  make4::buf[0] = 0xf7;
  make4::buf[1] = 0xbf;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  test_to<char>((char *)make4::buf,0xffffffff);
  make2::buf[0] = 0xc0;
  make2::buf[1] = 0x80;
  test_to<char>((char *)make2::buf,0xffffffff);
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x80;
  make3::buf[2] = 0x80;
  test_to<char>((char *)make3::buf,0xffffffff);
  builtin_memcpy(make4::buf,"",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  make2::buf[0] = 0xc1;
  make2::buf[1] = 0xbf;
  test_to<char>((char *)make2::buf,0xffffffff);
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x81;
  make3::buf[2] = 0xbf;
  test_to<char>((char *)make3::buf,0xffffffff);
  builtin_memcpy(make4::buf,"\x7f",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x82;
  make3::buf[2] = 0x80;
  test_to<char>((char *)make3::buf,0xffffffff);
  builtin_memcpy(make4::buf,"\x80",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x9f;
  make3::buf[2] = 0xbf;
  test_to<char>((char *)make3::buf,0xffffffff);
  builtin_memcpy(make4::buf,"߿",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  builtin_memcpy(make4::buf,"耀",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  builtin_memcpy(make4::buf,"\xffff",4);
  test_to<char>((char *)make4::buf,0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Invalid surrogate",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  test_to<char>((char *)make3::buf,0xffffffff);
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xaf;
  make3::buf[2] = 0xbf;
  test_to<char>((char *)make3::buf,0xffffffff);
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xb0;
  make3::buf[2] = 0x80;
  test_to<char>((char *)make3::buf,0xffffffff);
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  test_to<char>((char *)make3::buf,0xffffffff);
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xa0;
  make4::buf[3] = 0x80;
  test_to<char>((char *)make4::buf,0xffffffff);
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xaf;
  make4::buf[3] = 0xbf;
  test_to<char>((char *)make4::buf,0xffffffff);
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xb0;
  make4::buf[3] = 0x80;
  test_to<char>((char *)make4::buf,0xffffffff);
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  test_to<char>((char *)make4::buf,0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Incomplete",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  test_to<char>("",0xfffffffe);
  test_to<char>(anon_var_dwarf_3a8c + 4,0xffffffff);
  test_to<char>(anon_var_dwarf_3b04,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b0e,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b18,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b22,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b2c,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b36,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b40,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b4a,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b54,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b5e,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b68,0xfffffffe);
  test_to<char>(anon_var_dwarf_3b72,0xfffffffe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- To UTF-8",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Test correct",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  test_from<char>("\x7f",0x7f);
  test_from<char>(anon_var_dwarf_3637,0x80);
  test_from<char>(anon_var_dwarf_364d,0x7ff);
  test_from<char>(anon_var_dwarf_3657,0x800);
  test_from<char>(anon_var_dwarf_366d,0xffff);
  test_from<char>(anon_var_dwarf_3677,0x10000);
  test_from<char>(anon_var_dwarf_368d,0x10ffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test UTF-16",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- From UTF-16",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Correct",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u16_seq::buf[0] = 0x10;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10);
  u16_seq::buf[0] = 0xffff;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xffff);
  u16_seq::buf[0] = 0xd800;
  u16_seq::buf[1] = 0xdc00;
  u16_seq::buf[2] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10000);
  u16_seq::buf[0] = 0xdbff;
  u16_seq::buf[1] = 0xdfff;
  u16_seq::buf[2] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10ffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Invalid surrogate",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u16_seq::buf[0] = 0xdfff;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xffffffff);
  u16_seq::buf[0] = 0xdc00;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Incomplete",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u16_seq::buf[0] = 0;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xfffffffe);
  u16_seq::buf[0] = 0xd800;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xfffffffe);
  u16_seq::buf[0] = 0xdbff;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xfffffffe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- To UTF-16",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Test correct",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u16_seq::buf[0] = 0x10;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10);
  u16_seq::buf[0] = 0xffff;
  u16_seq::buf[1] = 0;
  test_to<unsigned_short>(u16_seq::buf,0xffff);
  u16_seq::buf[0] = 0xd800;
  u16_seq::buf[1] = 0xdc00;
  u16_seq::buf[2] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10000);
  u16_seq::buf[0] = 0xdbff;
  u16_seq::buf[1] = 0xdfff;
  u16_seq::buf[2] = 0;
  test_to<unsigned_short>(u16_seq::buf,0x10ffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test UTF-32",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- From UTF-32",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Correct",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u32_seq::buf[0] = 0x10;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0x10);
  u32_seq::buf[0] = 0xffff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffff);
  u32_seq::buf[0] = 0x10000;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0x10000);
  u32_seq::buf[0] = 0x10ffff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0x10ffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Invalid surrogate",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u32_seq::buf[0] = 0xd800;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffffffff);
  u32_seq::buf[0] = 0xdbff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffffffff);
  u32_seq::buf[0] = 0xdfff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffffffff);
  u32_seq::buf[0] = 0xdc00;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffffffff);
  u32_seq::buf[0] = 0x110000;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Incomplete",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u32_seq::buf[0] = 0;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xfffffffe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- To UTF-32",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Test correct",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  u32_seq::buf[0] = 0x10;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0x10);
  u32_seq::buf[0] = 0xffff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0xffff);
  u32_seq::buf[0] = 0x10ffff;
  u32_seq::buf[1] = 0;
  test_to<unsigned_int>(u32_seq::buf,0x10ffff);
  iVar3 = test_counter - error_counter;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < error_counter) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,error_counter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  lVar1 = std::cout;
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::runtime_error::what + *(long *)(lVar1 + -0x18)) = 1;
  *(undefined8 *)(std::locale::~locale + *(long *)(lVar1 + -0x18)) = 5;
  poVar2 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"% of tests completed sucsessefully",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {

        std::cout << "Test UTF-8" << std::endl;
        std::cout << "- From UTF-8" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to("\x7f",0x7f);
        test_to("\xc2\x80",0x80);
        test_to("\xdf\xbf",0x7ff);
        test_to("\xe0\xa0\x80",0x800);
        test_to("\xef\xbf\xbf",0xffff);
        test_to("\xf0\x90\x80\x80",0x10000);
        test_to("\xf4\x8f\xbf\xbf",0x10ffff);

        std::cout << "-- Too big" << std::endl;
        test_to("\xf4\x9f\x80\x80",illegal); //  11 0000
        test_to("\xfb\xbf\xbf\xbf",illegal); // 3ff ffff
        test_to("\xf8\x90\x80\x80\x80",illegal);  // 400 0000
        test_to("\xfd\xbf\xbf\xbf\xbf\xbf",illegal);  // 7fff ffff

        std::cout << "-- Invalid length" << std::endl;

        /// test that this actually works
        test_to(make2(0x80),0x80);
        test_to(make2(0x7ff),0x7ff);

        test_to(make3(0x800),0x800);
        test_to(make3(0xffff),0xffff);

        test_to(make4(0x10000),0x10000);
        test_to(make4(0x10ffff),0x10ffff);

        test_to(make4(0x110000),illegal);
        test_to(make4(0x1fffff),illegal);
        
        test_to(make2(0),illegal);
        test_to(make3(0),illegal);
        test_to(make4(0),illegal);
        test_to(make2(0x7f),illegal);
        test_to(make3(0x7f),illegal);
        test_to(make4(0x7f),illegal);

        test_to(make3(0x80),illegal);
        test_to(make4(0x80),illegal);
        test_to(make3(0x7ff),illegal);
        test_to(make4(0x7ff),illegal);

        test_to(make4(0x8000),illegal);
        test_to(make4(0xffff),illegal);
        
        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(make3(0xd800),illegal);
        test_to(make3(0xdbff),illegal);
        test_to(make3(0xdc00),illegal);
        test_to(make3(0xdfff),illegal);

        test_to(make4(0xd800),illegal);
        test_to(make4(0xdbff),illegal);
        test_to(make4(0xdc00),illegal);
        test_to(make4(0xdfff),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to("",incomplete);

        test_to("\x80",illegal);
        test_to("\xc2",incomplete);
        
        test_to("\xdf",incomplete);

        test_to("\xe0",incomplete);
        test_to("\xe0\xa0",incomplete);

        test_to("\xef\xbf",incomplete);
        test_to("\xef",incomplete);

        test_to("\xf0\x90\x80",incomplete);
        test_to("\xf0\x90",incomplete);
        test_to("\xf0",incomplete);

        test_to("\xf4\x8f\xbf",incomplete);
        test_to("\xf4\x8f",incomplete);
        test_to("\xf4",incomplete);

        std::cout << "- To UTF-8" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_from("\x7f",0x7f);
        test_from("\xc2\x80",0x80);
        test_from("\xdf\xbf",0x7ff);
        test_from("\xe0\xa0\x80",0x800);
        test_from("\xef\xbf\xbf",0xffff);
        test_from("\xf0\x90\x80\x80",0x10000);
        test_from("\xf4\x8f\xbf\xbf",0x10ffff);

        std::cout << "Test UTF-16" << std::endl;
        std::cout << "- From UTF-16" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to(u16_seq(0x10),0x10);
        test_to(u16_seq(0xffff),0xffff);
        test_to(u16_seq(0xD800,0xDC00),0x10000);
        test_to(u16_seq(0xDBFF,0xDFFF),0x10FFFF);


        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(u16_seq(0xDFFF),illegal);
        test_to(u16_seq(0xDC00),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to(u16_seq(0),incomplete);
        test_to(u16_seq(0xD800),incomplete);
        test_to(u16_seq(0xDBFF),incomplete);

        std::cout << "- To UTF-16" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_to(u16_seq(0x10),0x10);
        test_to(u16_seq(0xffff),0xffff);
        test_to(u16_seq(0xD800,0xDC00),0x10000);
        test_to(u16_seq(0xDBFF,0xDFFF),0x10FFFF);


        std::cout << "Test UTF-32" << std::endl;
        std::cout << "- From UTF-32" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to(u32_seq(0x10),0x10);
        test_to(u32_seq(0xffff),0xffff);
        test_to(u32_seq(0x10000),0x10000);
        test_to(u32_seq(0x10ffff),0x10ffff);



        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(u32_seq(0xD800),illegal);
        test_to(u32_seq(0xDBFF),illegal);
        test_to(u32_seq(0xDFFF),illegal);
        test_to(u32_seq(0xDC00),illegal);
        test_to(u32_seq(0x110000),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to(u32_seq(0),incomplete);

        std::cout << "- To UTF-32" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_to(u32_seq(0x10),0x10);
        test_to(u32_seq(0xffff),0xffff);
        test_to(u32_seq(0x10ffff),0x10ffff);



    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}